

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbfgsb.c
# Opt level: O0

int formt_(integer *m,doublereal *wt,doublereal *sy,doublereal *ss,integer *col,doublereal *theta,
          integer *info)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  doublereal *a;
  long lVar6;
  long lVar7;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  int *in_RDI;
  integer *in_R8;
  double *in_R9;
  integer i__3;
  integer i__2;
  integer i__1;
  integer ss_offset;
  integer ss_dim1;
  integer sy_offset;
  integer sy_dim1;
  integer wt_offset;
  integer wt_dim1;
  integer local_58;
  
  iVar1 = *in_RDI;
  a = (doublereal *)(in_RCX + (long)(iVar1 + 1) * -8);
  iVar2 = *in_RDI;
  lVar6 = in_RDX + (long)(iVar2 + 1) * -8;
  iVar3 = *in_RDI;
  lVar7 = in_RSI + (long)(iVar3 + 1) * -8;
  iVar4 = *in_R8;
  for (formt_::j = 1; formt_::j <= iVar4; formt_::j = formt_::j + 1) {
    *(double *)(lVar7 + (long)(formt_::j * iVar3 + 1) * 8) = *in_R9 * a[formt_::j * iVar1 + 1];
  }
  iVar4 = *in_R8;
  for (formt_::i__ = 2; formt_::i__ <= iVar4; formt_::i__ = formt_::i__ + 1) {
    iVar5 = *in_R8;
    for (formt_::j = formt_::i__; formt_::j <= iVar5; formt_::j = formt_::j + 1) {
      if (formt_::j < formt_::i__) {
        local_58 = formt_::j;
      }
      else {
        local_58 = formt_::i__;
      }
      formt_::k1 = local_58 + -1;
      formt_::ddum = 0.0;
      for (formt_::k = 1; formt_::k <= formt_::k1; formt_::k = formt_::k + 1) {
        formt_::ddum = (*(double *)(lVar6 + (long)(formt_::i__ + formt_::k * iVar2) * 8) *
                       *(double *)(lVar6 + (long)(formt_::j + formt_::k * iVar2) * 8)) /
                       *(double *)(lVar6 + (long)(formt_::k + formt_::k * iVar2) * 8) + formt_::ddum
        ;
      }
      *(double *)(lVar7 + (long)(formt_::i__ + formt_::j * iVar3) * 8) =
           *in_R9 * a[formt_::i__ + formt_::j * iVar1] + formt_::ddum;
    }
  }
  dpofa_(a,in_R8,(integer *)in_R9,(integer *)CONCAT44(iVar3,iVar3 + 1));
  if (*_i__2 != 0) {
    *_i__2 = -3;
  }
  return 0;
}

Assistant:

int formt_(integer *m, doublereal *wt, doublereal *sy, 
	doublereal *ss, integer *col, doublereal *theta, integer *info)
{
    /* System generated locals */
    integer wt_dim1, wt_offset, sy_dim1, sy_offset, ss_dim1, ss_offset, i__1, 
	    i__2, i__3;

    /* Local variables */
    static integer i__, j, k, k1;
    static doublereal ddum;
    extern /* Subroutine */ int dpofa_(doublereal *, integer *, integer *, 
	    integer *);

/*     ************ */

/*     Subroutine formt */

/*       This subroutine forms the upper half of the pos. def. and symm. */
/*         T = theta*SS + L*D^(-1)*L', stores T in the upper triangle */
/*         of the array wt, and performs the Cholesky factorization of T */
/*         to produce J*J', with J' stored in the upper triangle of wt. */

/*     Subprograms called: */

/*       Linpack ... dpofa. */


/*                           *  *  * */

/*     NEOS, November 1994. (Latest revision June 1996.) */
/*     Optimization Technology Center. */
/*     Argonne National Laboratory and Northwestern University. */
/*     Written by */
/*                        Ciyou Zhu */
/*     in collaboration with R.H. Byrd, P. Lu-Chen and J. Nocedal. */


/*     ************ */
/*     Form the upper half of  T = theta*SS + L*D^(-1)*L', */
/*        store T in the upper triangle of the array wt. */
    /* Parameter adjustments */
    ss_dim1 = *m;
    ss_offset = 1 + ss_dim1;
    ss -= ss_offset;
    sy_dim1 = *m;
    sy_offset = 1 + sy_dim1;
    sy -= sy_offset;
    wt_dim1 = *m;
    wt_offset = 1 + wt_dim1;
    wt -= wt_offset;

    /* Function Body */
    i__1 = *col;
    for (j = 1; j <= i__1; ++j) {
	wt[j * wt_dim1 + 1] = *theta * ss[j * ss_dim1 + 1];
/* L52: */
    }
    i__1 = *col;
    for (i__ = 2; i__ <= i__1; ++i__) {
	i__2 = *col;
	for (j = i__; j <= i__2; ++j) {
	    k1 = min(i__,j) - 1;
	    ddum = 0.;
	    i__3 = k1;
	    for (k = 1; k <= i__3; ++k) {
		ddum += sy[i__ + k * sy_dim1] * sy[j + k * sy_dim1] / sy[k + 
			k * sy_dim1];
/* L53: */
	    }
	    wt[i__ + j * wt_dim1] = ddum + *theta * ss[i__ + j * ss_dim1];
/* L54: */
	}
/* L55: */
    }
/*     Cholesky factorize T to J*J' with */
/*        J' stored in the upper triangle of wt. */
    dpofa_(&wt[wt_offset], m, col, info);
    if (*info != 0) {
	*info = -3;
    }
    return 0;
}